

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

iterator LowerBound(ImVector<ImGuiStorage::Pair> *data,ImGuiID key)

{
  iterator pvVar1;
  size_t sVar2;
  iterator mid;
  size_t count2;
  size_t count;
  iterator last;
  iterator first;
  ImGuiID key_local;
  ImVector<ImGuiStorage::Pair> *data_local;
  
  last = ImVector<ImGuiStorage::Pair>::begin(data);
  pvVar1 = ImVector<ImGuiStorage::Pair>::end(data);
  sVar2 = (long)pvVar1 - (long)last >> 4;
  while (count2 = sVar2, count2 != 0) {
    sVar2 = count2 >> 1;
    if (last[sVar2].key < key) {
      last = last + sVar2 + 1;
      sVar2 = count2 - (sVar2 + 1);
    }
  }
  return last;
}

Assistant:

static ImVector<ImGuiStorage::Pair>::iterator LowerBound(ImVector<ImGuiStorage::Pair>& data, ImGuiID key)
{
    ImVector<ImGuiStorage::Pair>::iterator first = data.begin();
    ImVector<ImGuiStorage::Pair>::iterator last = data.end();
    size_t count = (size_t)(last - first);
    while (count > 0)
    {
        size_t count2 = count >> 1;
        ImVector<ImGuiStorage::Pair>::iterator mid = first + count2;
        if (mid->key < key)
        {
            first = ++mid;
            count -= count2 + 1;
        }
        else
        {
            count = count2;
        }
    }
    return first;
}